

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_resolver_util.cc
# Opt level: O0

Status __thiscall
google::protobuf::util::anon_unknown_1::DescriptorPoolTypeResolver::ResolveEnumType
          (DescriptorPoolTypeResolver *this,string *type_url,Enum *enum_type)

{
  DescriptorPool *this_00;
  bool bVar1;
  Enum *in_RCX;
  AlphaNum *b;
  string_view type_url_00;
  string_view message;
  Enum local_180;
  AlphaNum local_118;
  AlphaNum local_e8;
  string local_b8;
  undefined1 local_98 [16];
  string_view local_88;
  EnumDescriptor *local_78;
  EnumDescriptor *descriptor;
  undefined1 local_60 [16];
  undefined1 local_50 [8];
  Status status;
  string type_name;
  Enum *enum_type_local;
  string *type_url_local;
  DescriptorPoolTypeResolver *this_local;
  
  std::__cxx11::string::string((string *)&status);
  local_60 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)enum_type);
  b = local_60._8_8_;
  type_url_00._M_str = local_60._0_8_;
  type_url_00._M_len = (size_t)type_url;
  ParseTypeUrl((DescriptorPoolTypeResolver *)local_50,type_url_00,(string *)b);
  bVar1 = absl::lts_20250127::Status::ok((Status *)local_50);
  if (bVar1) {
    this_00 = (DescriptorPool *)type_url[1]._M_string_length;
    local_88 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)&status);
    local_78 = DescriptorPool::FindEnumTypeByName(this_00,local_88);
    if (local_78 == (EnumDescriptor *)0x0) {
      absl::lts_20250127::AlphaNum::AlphaNum(&local_e8,"Invalid type URL, unknown type: ");
      absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>
                (&local_118,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&status);
      absl::lts_20250127::StrCat_abi_cxx11_(&local_b8,(lts_20250127 *)&local_e8,&local_118,b);
      local_98 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_b8);
      message._M_str = local_98._0_8_;
      message._M_len = (size_t)this;
      absl::lts_20250127::InvalidArgumentError(message);
      std::__cxx11::string::~string((string *)&local_b8);
    }
    else {
      ConvertDescriptorToType(&local_180,local_78);
      Enum::operator=(in_RCX,&local_180);
      Enum::~Enum(&local_180);
      absl::lts_20250127::Status::Status((Status *)this);
    }
  }
  else {
    absl::lts_20250127::Status::Status((Status *)this,(Status *)local_50);
  }
  descriptor._0_4_ = 1;
  absl::lts_20250127::Status::~Status((Status *)local_50);
  std::__cxx11::string::~string((string *)&status);
  return (Status)(uintptr_t)this;
}

Assistant:

absl::Status ResolveEnumType(const std::string& type_url,
                               Enum* enum_type) override {
    std::string type_name;
    absl::Status status = ParseTypeUrl(type_url, &type_name);
    if (!status.ok()) {
      return status;
    }

    const EnumDescriptor* descriptor = pool_->FindEnumTypeByName(type_name);
    if (descriptor == nullptr) {
      return absl::InvalidArgumentError(
          absl::StrCat("Invalid type URL, unknown type: ", type_name));
    }
    *enum_type = ConvertDescriptorToType(*descriptor);
    return absl::Status();
  }